

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstackedlayout.cpp
# Opt level: O0

void __thiscall QStackedLayout::addItem(QStackedLayout *this,QLayoutItem *item)

{
  QWidget *widget_00;
  QMessageLogger *in_RSI;
  pointer in_RDI;
  long in_FS_OFFSET;
  QWidget *widget;
  unique_ptr<QLayoutItem,_std::default_delete<QLayoutItem>_> guard;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  char local_30 [32];
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  std::unique_ptr<QLayoutItem,std::default_delete<QLayoutItem>>::
  unique_ptr<std::default_delete<QLayoutItem>,void>
            ((unique_ptr<QLayoutItem,_std::default_delete<QLayoutItem>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_RDI);
  widget_00 = (QWidget *)(**(code **)(*(long *)&in_RSI->context + 0x68))();
  if (widget_00 == (QWidget *)0x0) {
    QMessageLogger::QMessageLogger(in_RSI,(char *)0x0,in_stack_ffffffffffffffb4,(char *)in_RDI);
    QMessageLogger::warning(local_30,"QStackedLayout::addItem: Only widgets can be added");
  }
  else {
    addWidget((QStackedLayout *)in_RSI,widget_00);
  }
  std::unique_ptr<QLayoutItem,_std::default_delete<QLayoutItem>_>::~unique_ptr
            ((unique_ptr<QLayoutItem,_std::default_delete<QLayoutItem>_> *)
             (ulong)CONCAT14(widget_00 == (QWidget *)0x0,in_stack_ffffffffffffffb0));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStackedLayout::addItem(QLayoutItem *item)
{
    std::unique_ptr<QLayoutItem> guard(item);
    QWidget *widget = item->widget();
    if (Q_UNLIKELY(!widget)) {
        qWarning("QStackedLayout::addItem: Only widgets can be added");
        return;
    }
    addWidget(widget);
}